

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::write_pointer<unsigned_long>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,unsigned_long value,format_specs *specs)

{
  int value_00;
  long in_RDX;
  unsigned_long in_RSI;
  basic_writer<fmt::v6::buffer_range<char>_> *in_RDI;
  pointer_writer<unsigned_long> *unaff_retaddr;
  format_specs *in_stack_00000008;
  format_specs specs_copy;
  pointer_writer<unsigned_long> pw;
  int num_digits;
  char **in_stack_ffffffffffffffa8;
  
  value_00 = count_digits<4u,unsigned_long>(in_RSI);
  if (in_RDX == 0) {
    to_unsigned<int>(value_00);
    reserve(in_RDI,(size_t)in_stack_ffffffffffffffa8);
    basic_writer<fmt::v6::buffer_range<char>>::pointer_writer<unsigned_long>::operator()
              ((pointer_writer<unsigned_long> *)in_RDI,in_stack_ffffffffffffffa8);
  }
  else {
    basic_writer<fmt::v6::buffer_range<char>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::pointer_writer<unsigned_long>&>
              ((basic_writer<fmt::v6::buffer_range<char>_> *)specs_copy._0_8_,in_stack_00000008,
               unaff_retaddr);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }